

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O3

void __thiscall FIX::SessionID::SessionID(SessionID *this)

{
  StringField::StringField((StringField *)this,8);
  (this->m_beginString).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00325970;
  StringField::StringField(&(this->m_senderCompID).super_StringField,0x31);
  (this->m_senderCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00325010;
  StringField::StringField(&(this->m_targetCompID).super_StringField,0x38);
  (this->m_targetCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00325400;
  (this->m_sessionQualifier)._M_dataplus._M_p = (pointer)&(this->m_sessionQualifier).field_2;
  (this->m_sessionQualifier)._M_string_length = 0;
  (this->m_sessionQualifier).field_2._M_local_buf[0] = '\0';
  (this->m_frozenString)._M_dataplus._M_p = (pointer)&(this->m_frozenString).field_2;
  (this->m_frozenString)._M_string_length = 0;
  (this->m_frozenString).field_2._M_local_buf[0] = '\0';
  toString(this,&this->m_frozenString);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }